

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointgrid.cpp
# Opt level: O0

bool __thiscall ON_PointGrid::Create(ON_PointGrid *this,int point_count0,int point_count1)

{
  int point_count1_local;
  int point_count0_local;
  ON_PointGrid *this_local;
  
  if (point_count0 < 1) {
    this_local._7_1_ = false;
  }
  else if (point_count1 < 1) {
    this_local._7_1_ = false;
  }
  else {
    this->m_point_count[0] = point_count0;
    this->m_point_count[1] = point_count1;
    this->m_point_stride0 = this->m_point_count[1];
    ON_SimpleArray<ON_3dPoint>::Reserve
              (&(this->m_point).super_ON_SimpleArray<ON_3dPoint>,
               (long)(this->m_point_count[0] * this->m_point_count[1]));
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
ON_PointGrid::Create(
        int point_count0,  // cv count0 (>= order0)
        int point_count1   // cv count1 (>= order1)
        )
{
  if ( point_count0 < 1 )
    return false;
  if ( point_count1 < 1 )
    return false;
  m_point_count[0] = point_count0;
  m_point_count[1] = point_count1;
  m_point_stride0 = m_point_count[1];
  m_point.Reserve(m_point_count[0]*m_point_count[1]);
  return true;
}